

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

ActionResultHolder<std::error_code> *
testing::internal::ActionResultHolder<std::error_code>::PerformDefaultAction<std::error_code(long)>
          (FunctionMocker<std::error_code_(long)> *func_mocker,ArgumentTuple *args,
          string *call_description)

{
  ActionResultHolder<std::error_code> *pAVar1;
  Result RVar2;
  
  pAVar1 = (ActionResultHolder<std::error_code> *)operator_new(0x18);
  RVar2 = FunctionMocker<std::error_code_(long)>::PerformDefaultAction
                    (func_mocker,args,call_description);
  (pAVar1->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001a8b28;
  (pAVar1->result_).value_._M_value = RVar2._M_value;
  (pAVar1->result_).value_._M_cat = RVar2._M_cat;
  return pAVar1;
}

Assistant:

static ActionResultHolder* PerformDefaultAction(
      const FunctionMocker<F>* func_mocker,
      typename Function<F>::ArgumentTuple&& args,
      const std::string& call_description) {
    return new ActionResultHolder(Wrapper(func_mocker->PerformDefaultAction(
        std::move(args), call_description)));
  }